

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O1

char * cbor_print_bytes_part(char *out,char *out_max,uint8_t *in,int64_t val)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  
  if (out + 1 < out_max && 0 < val) {
    lVar4 = 1;
    do {
      bVar2 = in[lVar4 + -1];
      bVar6 = (bVar2 >> 4) + 0x57;
      if (bVar2 < 0xa0) {
        bVar6 = bVar2 >> 4 | 0x30;
      }
      bVar2 = bVar2 & 0xf;
      bVar5 = bVar2 + 0x57;
      if (bVar2 < 10) {
        bVar5 = bVar2 + 0x30;
      }
      *out = bVar6;
      pbVar1 = (byte *)out + 2;
      ((byte *)out)[1] = bVar5;
    } while ((lVar4 < val) &&
            (pbVar3 = (byte *)out + 3, lVar4 = lVar4 + 1, out = (char *)pbVar1, pbVar3 < out_max));
    return (char *)pbVar1;
  }
  return out;
}

Assistant:

char* cbor_print_bytes_part(char* out, char const* out_max, uint8_t* in, int64_t val)
{
    for (int64_t i = 0; i < val && out + 1 < out_max; i++) {
        int c = in[i];
        *out++ = hex_to_char(c >> 4);
		*out++ = hex_to_char(c);
    }

    return out;
}